

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

bool __thiscall
QMetaMethod::invoke(QMetaMethod *this,Data object,uint connectionType,QMetaTypeInterface **param_4,
                   char *param_5,undefined8 param_6,void *param_7,char *param_8,void *param_9,
                   char *param_10,void *param_11,char *param_12,void *param_13,char *param_14,
                   void *param_15,char *param_16,void *param_17,char *param_18,void *param_19,
                   char *param_20,void *param_21,char *param_22,void *param_23,char *param_24,
                   void *param_25,char *param_26)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long in_FS_OFFSET;
  QMetaMethod self;
  void *param [11];
  char *typeNames [11];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QMetaMethod *)this->mobj == (QMetaMethod *)0x0 || object.d == (uint *)0x0) {
    bVar2 = false;
  }
  else {
    typeNames[1] = param_8;
    typeNames[2] = param_10;
    typeNames[3] = param_12;
    typeNames[4] = param_14;
    typeNames[5] = param_16;
    typeNames[6] = param_18;
    typeNames[7] = param_20;
    typeNames[8] = param_22;
    typeNames[9] = param_24;
    typeNames[10] = param_26;
    param[1] = param_7;
    param[2] = param_9;
    param[3] = param_11;
    param[4] = param_13;
    param[5] = param_15;
    param[6] = param_17;
    param[7] = param_19;
    param[8] = param_21;
    param[9] = param_23;
    param[10] = param_25;
    lVar3 = 1;
    do {
      if ((typeNames[lVar3] == (char *)0x0) || (*typeNames[lVar3] == '\0')) goto LAB_0028625c;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xb);
    lVar3 = 0xb;
LAB_0028625c:
    self.data.d = object.d;
    self.mobj = (QMetaObject *)(this->data).d;
    param[0] = param_4;
    typeNames[0] = param_5;
    bVar2 = invokeImpl((QMetaMethod *)this->mobj,self,(void *)(ulong)connectionType,
                       (ConnectionType)lVar3,(qsizetype)param,typeNames,(char **)0x0,param_4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaMethod::invoke(QObject *object,
                         Qt::ConnectionType connectionType,
                         QGenericReturnArgument returnValue,
                         QGenericArgument val0,
                         QGenericArgument val1,
                         QGenericArgument val2,
                         QGenericArgument val3,
                         QGenericArgument val4,
                         QGenericArgument val5,
                         QGenericArgument val6,
                         QGenericArgument val7,
                         QGenericArgument val8,
                         QGenericArgument val9) const
{
    if (!object || !mobj)
        return false;

    // check argument count (we don't allow invoking a method if given too few arguments)
    const char *typeNames[] = {
        returnValue.name(),
        val0.name(),
        val1.name(),
        val2.name(),
        val3.name(),
        val4.name(),
        val5.name(),
        val6.name(),
        val7.name(),
        val8.name(),
        val9.name()
    };
    void *param[] = {
        returnValue.data(),
        val0.data(),
        val1.data(),
        val2.data(),
        val3.data(),
        val4.data(),
        val5.data(),
        val6.data(),
        val7.data(),
        val8.data(),
        val9.data()
    };

    int paramCount;
    for (paramCount = 1; paramCount < MaximumParamCount; ++paramCount) {
        if (qstrlen(typeNames[paramCount]) <= 0)
            break;
    }
    return invokeImpl(*this, object, connectionType, paramCount, param, typeNames, nullptr);
}